

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool.c
# Opt level: O0

tool_t * create_tool(char *tool_name)

{
  FILE *pFVar1;
  uint uVar2;
  uint uVar3;
  gotcha_configuration_t gVar4;
  char *local_90;
  char *local_68;
  char *local_48;
  tool_t *newtool;
  char *tool_name_local;
  
  pFVar1 = _stderr;
  if (0 < debug_level) {
    uVar2 = gotcha_gettid();
    uVar3 = getpid();
    local_48 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/tool.c"
                       ,0x2f);
    if (local_48 == (char *)0x0) {
      local_48 = "";
    }
    fprintf(pFVar1,"[%d/%d][%s:%u] - Found no existing tool with name %s\n",(ulong)uVar2,
            (ulong)uVar3,local_48 + 1,0x41,tool_name);
  }
  tool_name_local = (char *)malloc(0x58);
  pFVar1 = _stderr;
  if ((tool_t *)tool_name_local == (tool_t *)0x0) {
    if (debug_level != 0) {
      uVar2 = gotcha_gettid();
      uVar3 = getpid();
      local_68 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/tool.c"
                         ,0x2f);
      if (local_68 == (char *)0x0) {
        local_68 = "";
      }
      fprintf(pFVar1,"ERROR [%d/%d][%s:%u] - Failed to malloc tool %s\n",(ulong)uVar2,(ulong)uVar3,
              local_68 + 1,0x45,tool_name);
    }
    tool_name_local = (char *)0x0;
  }
  else {
    ((tool_t *)tool_name_local)->tool_name = tool_name;
    ((tool_t *)tool_name_local)->binding = (binding_t *)0x0;
    gVar4 = get_default_configuration();
    (((tool_t *)tool_name_local)->config).priority = gVar4.priority;
    reorder_tool((tool_t *)tool_name_local);
    ((tool_t *)tool_name_local)->parent_tool = (tool_t *)0x0;
    create_hashtable(&((tool_t *)tool_name_local)->child_tools,0x18,strhash,strcmp);
    pFVar1 = _stderr;
    if (0 < debug_level) {
      uVar2 = gotcha_gettid();
      uVar3 = getpid();
      local_90 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/tool.c"
                         ,0x2f);
      if (local_90 == (char *)0x0) {
        local_90 = "";
      }
      fprintf(pFVar1,"[%d/%d][%s:%u] - Created new tool %s\n",(ulong)uVar2,(ulong)uVar3,local_90 + 1
              ,0x51,tool_name);
    }
  }
  return (tool_t *)tool_name_local;
}

Assistant:

tool_t *create_tool(const char *tool_name) {
  debug_printf(1, "Found no existing tool with name %s\n", tool_name);
  // TODO: ensure free
  tool_t *newtool = (tool_t *)gotcha_malloc(sizeof(tool_t));
  if (!newtool) {
    error_printf("Failed to malloc tool %s\n", tool_name);  // GCOVR_EXCL_LINE
    return NULL;                                            // GCOVR_EXCL_LINE
  }
  newtool->tool_name = tool_name;
  newtool->binding = NULL;
  // newtool->next_tool = tools;
  newtool->config = get_default_configuration();
  reorder_tool(newtool);
  newtool->parent_tool = NULL;
  create_hashtable(&newtool->child_tools, 24, (hash_func_t)strhash,
                   (hash_cmp_t)gotcha_strcmp);
  // tools = newtool;
  debug_printf(1, "Created new tool %s\n", tool_name);
  return newtool;
}